

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainToVar
          (InterfaceVariableScalarReplacement *this,uint32_t var_type_id,Instruction *var,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *index_ids,Instruction *insert_before,
          uint32_t *component_type_id)

{
  IRContext *c;
  pointer puVar1;
  uint32_t uVar2;
  StorageClass storage_class;
  uint32_t res_id;
  DefUseManager *def_use_mgr;
  Instruction *this_00;
  pointer puVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b8;
  uint32_t local_ac;
  Operand local_a8;
  uint local_78 [8];
  SmallVector<unsigned_int,_2UL> local_58;
  
  def_use_mgr = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar2 = anon_unknown_0::GetComponentTypeOfArrayMatrix
                    (def_use_mgr,var_type_id,
                     (uint32_t)
                     ((ulong)((long)(index_ids->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(index_ids->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  *component_type_id = uVar2;
  storage_class = anon_unknown_0::GetStorageClass(var);
  uVar2 = GetPointerType(this,uVar2,storage_class);
  this_00 = (Instruction *)::operator_new(0x70);
  c = (this->super_Pass).context_;
  res_id = Pass::TakeNextId(&this->super_Pass);
  local_ac = Instruction::result_id(var);
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_a8.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)local_78,
             &local_a8,local_78);
  Instruction::Instruction(this_00,c,OpAccessChain,uVar2,res_id,(OperandList *)local_78);
  local_b8._M_head_impl = this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  puVar1 = (index_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (index_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_78[0] = *puVar3;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_78;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_a8.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&this_00->operands_,&local_a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  analysis::DefUseManager::AnalyzeInstDefUse(def_use_mgr,this_00);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_b8);
  if (local_b8._M_head_impl != (Instruction *)0x0) {
    (*((local_b8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return this_00;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainToVar(
    uint32_t var_type_id, Instruction* var,
    const std::vector<uint32_t>& index_ids, Instruction* insert_before,
    uint32_t* component_type_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  *component_type_id = GetComponentTypeOfArrayMatrix(
      def_use_mgr, var_type_id, static_cast<uint32_t>(index_ids.size()));

  uint32_t ptr_type_id =
      GetPointerType(*component_type_id, GetStorageClass(var));

  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
  for (uint32_t index_id : index_ids) {
    new_access_chain->AddOperand({SPV_OPERAND_TYPE_ID, {index_id}});
  }

  Instruction* inst = new_access_chain.get();
  def_use_mgr->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}